

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void COVER_best_finish(COVER_best_t *best,ZDICT_cover_params_t parameters,
                      COVER_dictSelection_t selection)

{
  long lVar1;
  undefined8 __size;
  undefined8 uVar2;
  void *pvVar3;
  pthread_mutex_t *in_RDI;
  size_t liveJobs;
  size_t dictSize;
  size_t compressedSize;
  void *dict;
  void *in_stack_00000038;
  
  __size = parameters._0_8_;
  uVar2 = parameters._8_8_;
  if (in_RDI != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(in_RDI);
    *(long *)((long)in_RDI + 0x58) = *(long *)((long)in_RDI + 0x58) + -1;
    lVar1 = *(long *)((long)in_RDI + 0x58);
    if ((ulong)uVar2 < (ulong)in_RDI[4].__align) {
      if ((*(long *)((long)in_RDI + 0x60) == 0) || (*(ulong *)((long)in_RDI + 0x68) < (ulong)__size)
         ) {
        if (*(long *)((long)in_RDI + 0x60) != 0) {
          free(*(void **)((long)in_RDI + 0x60));
        }
        pvVar3 = malloc(__size);
        *(void **)((long)in_RDI + 0x60) = pvVar3;
        if (*(long *)((long)in_RDI + 0x60) == 0) {
          in_RDI[4].__align = -1;
          *(undefined8 *)((long)in_RDI + 0x68) = 0;
          pthread_cond_signal((pthread_cond_t *)(in_RDI + 1));
          pthread_mutex_unlock(in_RDI);
          return;
        }
      }
      if (in_stack_00000038 != (void *)0x0) {
        memcpy(*(void **)((long)in_RDI + 0x60),in_stack_00000038,__size);
        *(undefined8 *)((long)in_RDI + 0x68) = __size;
        memcpy((void *)((long)in_RDI + 0x70),&stack0x00000008,0x30);
        in_RDI[4].__align = uVar2;
      }
    }
    if (lVar1 == 0) {
      pthread_cond_broadcast((pthread_cond_t *)(in_RDI + 1));
    }
    pthread_mutex_unlock(in_RDI);
  }
  return;
}

Assistant:

void COVER_best_finish(COVER_best_t *best, ZDICT_cover_params_t parameters,
                              COVER_dictSelection_t selection) {
  void* dict = selection.dictContent;
  size_t compressedSize = selection.totalCompressedSize;
  size_t dictSize = selection.dictSize;
  if (!best) {
    return;
  }
  {
    size_t liveJobs;
    ZSTD_pthread_mutex_lock(&best->mutex);
    --best->liveJobs;
    liveJobs = best->liveJobs;
    /* If the new dictionary is better */
    if (compressedSize < best->compressedSize) {
      /* Allocate space if necessary */
      if (!best->dict || best->dictSize < dictSize) {
        if (best->dict) {
          free(best->dict);
        }
        best->dict = malloc(dictSize);
        if (!best->dict) {
          best->compressedSize = ERROR(GENERIC);
          best->dictSize = 0;
          ZSTD_pthread_cond_signal(&best->cond);
          ZSTD_pthread_mutex_unlock(&best->mutex);
          return;
        }
      }
      /* Save the dictionary, parameters, and size */
      if (dict) {
        memcpy(best->dict, dict, dictSize);
        best->dictSize = dictSize;
        best->parameters = parameters;
        best->compressedSize = compressedSize;
      }
    }
    if (liveJobs == 0) {
      ZSTD_pthread_cond_broadcast(&best->cond);
    }
    ZSTD_pthread_mutex_unlock(&best->mutex);
  }
}